

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<long,long,long,duckdb::ExclusiveBetweenOperator,true,true,true>
                (long *adata,long *bdata,long *cdata,SelectionVector *result_sel,idx_t count,
                SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  idx_t i;
  ulong uVar13;
  
  psVar1 = asel->sel_vector;
  psVar2 = bsel->sel_vector;
  psVar3 = csel->sel_vector;
  lVar11 = 0;
  iVar7 = 0;
  for (uVar13 = 0; count != uVar13; uVar13 = uVar13 + 1) {
    uVar12 = uVar13;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar12 = (ulong)result_sel->sel_vector[uVar13];
    }
    uVar8 = uVar13;
    if (psVar1 != (sel_t *)0x0) {
      uVar8 = (ulong)psVar1[uVar13];
    }
    uVar9 = uVar13;
    if (psVar2 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar2[uVar13];
    }
    uVar10 = uVar13;
    if (psVar3 != (sel_t *)0x0) {
      uVar10 = (ulong)psVar3[uVar13];
    }
    lVar4 = adata[uVar8];
    lVar5 = bdata[uVar9];
    lVar6 = cdata[uVar10];
    true_sel->sel_vector[iVar7] = (sel_t)uVar12;
    iVar7 = iVar7 + (lVar4 < lVar6 && lVar5 < lVar4);
    false_sel->sel_vector[lVar11] = (sel_t)uVar12;
    lVar11 = lVar11 + (ulong)(lVar4 >= lVar6 || lVar5 >= lVar4);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}